

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O3

void polar_normal_weights_wrapper<dense_parameters>::func(weight *w,uint64_t index)

{
  float fVar1;
  uint64_t local_18;
  
  local_18 = index;
  do {
    do {
      fVar1 = merand48(&local_18);
      func::x1 = fVar1 + fVar1 + -1.0;
      fVar1 = merand48(&local_18);
      func::x2 = fVar1 + fVar1 + -1.0;
      func::temp = func::x1 * func::x1 + func::x2 * func::x2;
    } while (1.0 <= func::temp);
  } while ((func::temp == 0.0) && (!NAN(func::temp)));
  fVar1 = logf(func::temp);
  fVar1 = (fVar1 * -2.0) / func::temp;
  if (fVar1 < 0.0) {
    func::temp = sqrtf(fVar1);
  }
  else {
    func::temp = SQRT(fVar1);
  }
  *w = func::temp * func::x1;
  return;
}

Assistant:

static void func(weight& w, uint64_t index)
  {
    static float x1 = 0.0;
    static float x2 = 0.0;
    static float temp = 0.0;
    do
    {
      x1 = 2.0f * merand48(index) - 1.0f;
      x2 = 2.0f * merand48(index) - 1.0f;
      temp = x1 * x1 + x2 * x2;
    } while ((temp >= 1.0) || (temp == 0.0));
    temp = sqrtf((-2.0f * logf(temp)) / temp);
    w = x1 * temp;
  }